

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

FloatImage * __thiscall nv::FloatImage::fastDownSample(FloatImage *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  float *pfVar4;
  uint uVar5;
  uint uVar6;
  FloatImage *this_00;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint y_1;
  uint uVar11;
  float *pfVar12;
  uint c;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  float *pfVar16;
  uint uVar17;
  uint y;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  ushort uVar21;
  uint uVar22;
  ushort uVar23;
  uint uVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  this_00 = (FloatImage *)operator_new(0x20);
  this_00->_vptr_FloatImage = (_func_int **)&PTR__FloatImage_0023d850;
  this_00->m_mem = (float *)0x0;
  this_00->m_width = 0;
  this_00->m_height = 0;
  this_00->m_componentNum = 0;
  this_00->m_count = 0;
  uVar1 = this->m_width;
  uVar23 = uVar1 >> 1;
  uVar23 = uVar23 + (uVar23 == 0);
  uVar24 = (uint)uVar23;
  uVar21 = this->m_height >> 1;
  uVar21 = uVar21 + (uVar21 == 0);
  uVar22 = (uint)uVar21;
  allocate(this_00,this->m_componentNum,uVar24,uVar22);
  uVar2 = this->m_width;
  uVar14 = (uint)uVar2;
  uVar3 = this->m_height;
  uVar6 = (uint)uVar3;
  if (uVar3 == 1 || uVar2 == 1) {
    uVar22 = uVar22 * uVar24;
    uVar14 = uVar3 * uVar14;
    if ((uVar14 & 1) == 0) {
      uVar6 = this->m_componentNum;
      pfVar4 = this->m_mem;
      uVar24 = 0;
      for (uVar15 = 0; uVar15 != uVar6; uVar15 = uVar15 + 1) {
        uVar1 = this_00->m_width;
        uVar2 = this_00->m_height;
        pfVar20 = this_00->m_mem;
        for (lVar18 = 0; uVar22 != (uint)lVar18; lVar18 = lVar18 + 1) {
          pfVar20[(ulong)((uint)uVar1 * (int)uVar15 * (uint)uVar2) + lVar18] =
               (pfVar4[(ulong)uVar24 + lVar18 * 2] + pfVar4[(ulong)uVar24 + lVar18 * 2 + 1]) * 0.5;
        }
        uVar24 = uVar24 + uVar14;
      }
    }
    else {
      uVar6 = this->m_componentNum;
      pfVar4 = this->m_mem;
      uVar24 = 0;
      for (uVar15 = 0; uVar15 != uVar6; uVar15 = uVar15 + 1) {
        uVar1 = this_00->m_width;
        uVar2 = this_00->m_height;
        pfVar20 = this_00->m_mem;
        lVar18 = 0;
        uVar5 = uVar22;
        while (uVar5 != 0) {
          pfVar20[(ulong)((uint)uVar1 * (int)uVar15 * (uint)uVar2) + lVar18] =
               ((float)(int)(lVar18 + 1) * pfVar4[(ulong)uVar24 + lVar18 * 2 + 2] +
               (float)uVar5 * pfVar4[(ulong)uVar24 + lVar18 * 2] +
               pfVar4[(ulong)uVar24 + lVar18 * 2 + 1] * (float)(int)uVar22) *
               (1.0 / (float)(int)(uVar22 * 2 + 1));
          lVar18 = lVar18 + 1;
          uVar5 = uVar5 - 1;
        }
        uVar24 = uVar24 + uVar14;
      }
    }
  }
  else if (((uVar3 | uVar2) & 1) == 0) {
    uVar6 = this->m_componentNum;
    pfVar4 = this->m_mem;
    uVar1 = uVar1 >> 1;
    for (uVar15 = 0; uVar15 != uVar6; uVar15 = uVar15 + 1) {
      pfVar20 = pfVar4 + uVar3 * uVar14 * (int)uVar15;
      pfVar16 = this_00->m_mem + (uint)this_00->m_height * (uint)this_00->m_width * (int)uVar15;
      for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
        lVar18 = 0;
        for (lVar25 = 0; ((uint)uVar1 + (uint)(uVar1 == 0)) * 4 != (int)lVar25; lVar25 = lVar25 + 4)
        {
          *(float *)((long)pfVar16 + lVar25) =
               (*(float *)((long)pfVar20 + lVar25 * 2) + *(float *)((long)pfVar20 + lVar25 * 2 + 4)
                + *(float *)((long)pfVar20 + lVar25 * 2 + (ulong)(uVar14 * 4)) +
               *(float *)((long)pfVar20 + lVar25 * 2 + (ulong)(uVar14 * 4) + 4)) * 0.25;
          lVar18 = lVar18 + -8;
        }
        pfVar20 = (float *)((long)pfVar20 + ((ulong)(uVar14 * 4) - lVar18));
        pfVar16 = (float *)((long)pfVar16 + lVar25);
      }
    }
  }
  else if ((uVar2 & 1) == 0) {
    if ((uVar3 & 1) != 0) {
      uVar24 = this->m_componentNum;
      pfVar4 = this->m_mem;
      uVar15 = (ulong)(uVar14 * 8);
      uVar7 = 0;
      for (uVar19 = 0; uVar19 != uVar24; uVar19 = uVar19 + 1) {
        lVar18 = (long)pfVar4 + uVar7 * 4 + uVar15 + 4;
        pfVar20 = pfVar4 + (ulong)uVar14 + uVar7 + 1;
        pfVar16 = pfVar4 + uVar6 * uVar14 * (int)uVar19;
        pfVar12 = this_00->m_mem + (uint)this_00->m_height * (uint)this_00->m_width * (int)uVar19;
        iVar9 = 0;
        while (uVar5 = uVar22 - iVar9, uVar5 != 0) {
          iVar9 = iVar9 + 1;
          for (lVar25 = 0; (ulong)uVar23 << 2 != lVar25; lVar25 = lVar25 + 4) {
            *(float *)((long)pfVar12 + lVar25) =
                 ((*(float *)(lVar18 + -4 + lVar25 * 2) + *(float *)(lVar18 + lVar25 * 2)) *
                  (float)iVar9 +
                 (*(float *)((long)pfVar20 + lVar25 * 2 + -4) +
                 *(float *)((long)pfVar20 + lVar25 * 2)) * (float)(int)(short)uVar21 +
                 (*(float *)((long)pfVar16 + lVar25 * 2) +
                 *(float *)((long)pfVar16 + lVar25 * 2 + 4)) * (float)uVar5 + 0.0) *
                 (1.0 / (float)(uVar6 * 2));
          }
          pfVar16 = (float *)((long)pfVar16 + uVar15);
          lVar18 = lVar18 + uVar15;
          pfVar20 = (float *)((long)pfVar20 + uVar15);
          pfVar12 = (float *)((long)pfVar12 + lVar25);
        }
        uVar7 = (ulong)((int)uVar7 + uVar6 * uVar14);
      }
    }
  }
  else {
    uVar15 = (ulong)(uVar14 * 8);
    uVar5 = this->m_componentNum;
    fVar26 = (float)(int)(short)uVar23;
    pfVar4 = this->m_mem;
    if ((uVar3 & 1) == 0) {
      uVar7 = 0;
      for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
        pfVar20 = pfVar4 + (ulong)uVar14 + uVar7 + 2;
        pfVar16 = pfVar4 + uVar6 * uVar14 * (int)uVar19;
        pfVar12 = this_00->m_mem + (uint)this_00->m_height * (uint)this_00->m_width * (int)uVar19;
        for (uVar11 = 0; uVar11 != uVar22; uVar11 = uVar11 + 1) {
          uVar13 = 1;
          uVar17 = uVar24;
          for (uVar8 = 0; uVar24 * 4 != uVar8; uVar8 = uVar8 + 4) {
            *(float *)((long)pfVar12 + uVar8) =
                 ((*(float *)((long)pfVar16 + uVar8 * 2 + 8) + *(float *)((long)pfVar20 + uVar8 * 2)
                  ) * (float)uVar13 +
                 (*(float *)((long)pfVar16 + uVar8 * 2 + 4) +
                 *(float *)((long)pfVar20 + uVar8 * 2 + -4)) * fVar26 +
                 (*(float *)((long)pfVar16 + uVar8 * 2) + *(float *)((long)pfVar20 + uVar8 * 2 + -8)
                 ) * (float)uVar17 + 0.0) * (1.0 / (float)(uVar14 * 2));
            uVar17 = uVar17 - 1;
            uVar13 = uVar13 + 1;
          }
          pfVar16 = (float *)((long)pfVar16 + uVar15);
          pfVar20 = (float *)((long)pfVar20 + uVar15);
          pfVar12 = (float *)((long)pfVar12 + uVar8);
        }
        uVar7 = (ulong)((int)uVar7 + uVar6 * uVar14);
      }
    }
    else {
      iVar9 = uVar6 * uVar14;
      uVar7 = 0;
      for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
        lVar18 = (long)pfVar4 + uVar7 * 4 + uVar15 + 4;
        pfVar20 = pfVar4 + (ulong)uVar14 + uVar7 + 1;
        pfVar16 = pfVar4 + (uint)(iVar9 * (int)uVar19);
        pfVar12 = this_00->m_mem + (uint)this_00->m_height * (uint)this_00->m_width * (int)uVar19;
        iVar10 = 0;
        while (uVar6 = uVar22 - iVar10, uVar6 != 0) {
          iVar10 = iVar10 + 1;
          uVar17 = 1;
          uVar11 = uVar24;
          for (uVar8 = 0; uVar24 * 4 != uVar8; uVar8 = uVar8 + 4) {
            fVar27 = (float)uVar11;
            fVar28 = (float)uVar17 * *(float *)((long)pfVar16 + uVar8 * 2 + 8);
            *(float *)((long)pfVar12 + uVar8) =
                 ((fVar27 * *(float *)(lVar18 + -4 + uVar8 * 2) +
                   *(float *)(lVar18 + uVar8 * 2) * fVar26 + fVar28) * (float)iVar10 +
                 (*(float *)((long)pfVar20 + uVar8 * 2 + -4) * fVar27 +
                  *(float *)((long)pfVar20 + uVar8 * 2) * fVar26 + fVar28) *
                 (float)(int)(short)uVar21 +
                 (*(float *)((long)pfVar16 + uVar8 * 2) * fVar27 +
                  *(float *)((long)pfVar16 + uVar8 * 2 + 4) * fVar26 + fVar28) * (float)uVar6 + 0.0)
                 * (1.0 / (float)iVar9);
            uVar11 = uVar11 - 1;
            uVar17 = uVar17 + 1;
          }
          pfVar16 = (float *)((long)pfVar16 + uVar15);
          lVar18 = lVar18 + uVar15;
          pfVar20 = (float *)((long)pfVar20 + uVar15);
          pfVar12 = (float *)((long)pfVar12 + uVar8);
        }
        uVar7 = (ulong)(uint)((int)uVar7 + iVar9);
      }
    }
  }
  return this_00;
}

Assistant:

FloatImage * FloatImage::fastDownSample() const
{
	nvDebugCheck(m_width != 1 || m_height != 1);
	
	AutoPtr<FloatImage> dst_image( new FloatImage() );

	const uint w = max(1, m_width / 2);
	const uint h = max(1, m_height / 2);
	dst_image->allocate(m_componentNum, w, h);

	// 1D box filter.
	if (m_width == 1 || m_height == 1)
	{
		const uint n = w * h;
		
		if ((m_width * m_height) & 1)
		{
			const float scale = 1.0f / (2 * n + 1);
			
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					const float w0 = float(n - x);
					const float w1 = float(n - 0);
					const float w2 = float(1 + x);
					
					*dst++ = scale * (w0 * src[0] + w1 * src[1] + w2 * src[2]);
					src += 2;
				}
			}
		}
		else
		{
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					*dst = 0.5f * (src[0] + src[1]);
					dst++;
					src += 2;
				}
			}
		}
	}
	
	// Regular box filter.
	else if ((m_width & 1) == 0 && (m_height & 1) == 0)
	{
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for(uint x = 0; x < w; x++)
				{
					*dst = 0.25f * (src[0] + src[1] + src[m_width] + src[m_width + 1]);
					dst++;
					src += 2;
				}
				
				src += m_width;
			}
		}
	}
	
	// Polyphase filters.
	else if (m_width & 1 && m_height & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (m_width * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += v0 * (w0 * src[0 * m_width + 2 * x] + w1 * src[0 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v1 * (w0 * src[1 * m_width + 2 * x] + w1 * src[1 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v2 * (w0 * src[2 * m_width + 2 * x] + w1 * src[2 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_width & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		const float scale = 1.0f / (2 * m_width);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += w0 * (src[2 * x + 0] + src[m_width + 2 * x + 0]);
					f += w1 * (src[2 * x + 1] + src[m_width + 2 * x + 1]);
					f += w2 * (src[2 * x + 2] + src[m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_height & 1)
	{
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (2 * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					float f = 0.0f;
					f += v0 * (src[0 * m_width + 2 * x] + src[0 * m_width + 2 * x + 1]);
					f += v1 * (src[1 * m_width + 2 * x] + src[1 * m_width + 2 * x + 1]);
					f += v2 * (src[2 * m_width + 2 * x] + src[2 * m_width + 2 * x + 1]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	
	return dst_image.release();
}